

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFFileSpecObjectHelper.cc
# Opt level: O2

QPDFObjectHandle __thiscall
QPDFFileSpecObjectHelper::getEmbeddedFileStream(QPDFFileSpecObjectHelper *this,string *key)

{
  pointer pbVar1;
  bool bVar2;
  long in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  pointer pbVar3;
  QPDFObjectHandle QVar4;
  QPDFObjectHandle ef;
  allocator<char> local_69;
  undefined1 local_68 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_50;
  string local_48 [32];
  
  std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)(local_68 + 0x10),
             (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&key->_M_string_length);
  std::__cxx11::string::string<std::allocator<char>>(local_48,"/EF",&local_69);
  QPDFObjectHandle::getKey((QPDFObjectHandle *)local_68,(string *)(local_68 + 0x10));
  std::__cxx11::string::~string(local_48);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50);
  bVar2 = QPDFObjectHandle::isDictionary((QPDFObjectHandle *)local_68);
  pbVar1 = name_keys_abi_cxx11_.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (bVar2) {
    if (*(long *)(in_RDX + 8) != 0) {
      QPDFObjectHandle::getKey((QPDFObjectHandle *)this,(string *)local_68);
      goto LAB_00156d5a;
    }
    for (pbVar3 = name_keys_abi_cxx11_.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; pbVar3 != pbVar1; pbVar3 = pbVar3 + 1)
    {
      QPDFObjectHandle::getKey((QPDFObjectHandle *)this,(string *)local_68);
      bVar2 = QPDFObjectHandle::isStream((QPDFObjectHandle *)this);
      if (bVar2) goto LAB_00156d5a;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 &(this->super_QPDFObjectHelper).super_BaseHandle);
    }
  }
  QPDFObjectHandle::newNull();
LAB_00156d5a:
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_68 + 8));
  QVar4.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  QVar4.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (QPDFObjectHandle)
         QVar4.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

QPDFObjectHandle
QPDFFileSpecObjectHelper::getEmbeddedFileStream(std::string const& key)
{
    auto ef = oh().getKey("/EF");
    if (!ef.isDictionary()) {
        return QPDFObjectHandle::newNull();
    }
    if (!key.empty()) {
        return ef.getKey(key);
    }
    for (auto const& i: name_keys) {
        auto k = ef.getKey(i);
        if (k.isStream()) {
            return k;
        }
    }
    return QPDFObjectHandle::newNull();
}